

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.cpp
# Opt level: O3

void mbedtls_ct_memcpy_offset
               (uchar *dest,uchar *src,size_t offset,size_t offset_min,size_t offset_max,size_t len)

{
  size_t offsetval;
  ulong uVar1;
  
  if (offset_min <= offset_max) {
    do {
      uVar1 = offset ^ mbedtls_ct_zero ^ offset_min;
      mbedtls_ct_memcpy_if
                ((long)~(-(uVar1 >> 1) | -uVar1) >> 0x3f,dest,src + offset_min,(uchar *)0x0,len);
      offset_min = offset_min + 1;
    } while (offset_min <= offset_max);
  }
  return;
}

Assistant:

void mbedtls_ct_memcpy_offset(unsigned char *dest,
                              const unsigned char *src,
                              size_t offset,
                              size_t offset_min,
                              size_t offset_max,
                              size_t len)
{
    size_t offsetval;

    for (offsetval = offset_min; offsetval <= offset_max; offsetval++) {
        mbedtls_ct_memcpy_if(mbedtls_ct_uint_eq(offsetval, offset), dest, src + offsetval, NULL,
                             len);
    }
}